

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O1

Error asmjit::X86Internal::emitArgMove
                (X86Emitter *emitter,X86Reg *dst_,uint32_t dstTypeId,Operand_ *src_,
                uint32_t srcTypeId,bool avxEnabled,char *comment)

{
  byte bVar1;
  char cVar2;
  Reg *pRVar3;
  anon_union_16_7_ed616b9d_for_Operand__0 aVar4;
  uint uVar5;
  Error EVar6;
  ulong o1;
  Error EVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint32_t instId;
  bool bVar15;
  X86Reg dst;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_f0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_e0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_d0;
  X86Reg *pXStack_b8;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_b0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_a0;
  anon_union_16_7_ed616b9d_for_Operand__0 aStack_88;
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  
  if (dstTypeId == 0) {
    dstTypeId = (uint32_t)
                (byte)x86OpData[(ulong)((dst_->super_Reg).super_Operand.super_Operand_.field_0._any.
                                        signature >> 3 & 0x1f) + 0xa0];
  }
  EVar7 = dstTypeId - 0x20;
  if ((EVar7 < 0x45) && ((dstTypeId & 0x7e) != 0x20)) {
    uVar5 = srcTypeId - 0x20;
    if ((0x44 < uVar5) || ((srcTypeId & 0x7e) == 0x20)) goto LAB_00122b8f;
    local_38._packed[0] =
         (UInt64)*(undefined8 *)&(dst_->super_Reg).super_Operand.super_Operand_.field_0;
    local_38._mem.field_2 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._mem.field_2;
    local_48._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
    local_48._mem.field_2 = (src_->field_0)._mem.field_2;
    if (dstTypeId < 0x80) {
      if (0x7f < srcTypeId) goto LAB_00122b99;
      bVar1 = TypeId::_info[dstTypeId];
      uVar12 = (uint)bVar1;
      uVar11 = (uint)(byte)TypeId::_info[srcTypeId];
      uVar8 = 0;
      if (EVar7 < 10) {
        uVar8 = 0;
        if (uVar5 < 10) {
          uVar13 = dstTypeId << 8 | srcTypeId;
          uVar8 = 0x1a9;
          bVar15 = false;
          if ((int)uVar13 < 0x2822) {
            if (((uVar13 != 0x2422) && (uVar13 != 0x2622)) && (uVar13 != 0x2624)) {
LAB_001226e0:
              uVar8 = 0x1aa;
              bVar15 = true;
            }
          }
          else if ((uVar13 != 0x2822) && (uVar13 != 0x2824)) {
            if (uVar13 != 0x2826) goto LAB_001226e0;
            uVar8 = 0x1aa;
            bVar15 = false;
          }
          if (!bVar15) goto LAB_001229a6;
        }
        if ((uVar5 < 10) || (((src_->field_0)._any.signature & 7) == 2)) {
          if ((bVar1 < 5) && ((byte)TypeId::_info[srcTypeId] < 4)) {
            local_38._any.signature = 0x4000029;
            uVar8 = 0x1ad;
          }
          else {
            if (uVar12 < uVar11) {
              uVar11 = uVar12;
            }
            local_38._any.signature = 0x8000031;
            if (uVar11 == 4) {
              local_38._any.signature = 0x4000029;
            }
            uVar8 = 0x189;
            if ((local_48._any.signature & 7) == 1) {
              local_48._any.signature = local_38._any.signature;
            }
          }
          goto LAB_001229a6;
        }
        if (uVar12 < uVar11) {
          uVar11 = uVar12;
        }
        if (srcTypeId - 0x31 < 2) {
          uVar8 = 0x1a2;
          if (uVar11 != 8) {
            local_38._any.signature = 0x4000029;
            uVar8 = 0x18d;
          }
          goto LAB_001229a6;
        }
        if (srcTypeId - 0x2d < 4) {
          if (uVar11 == 1) {
            uVar8 = 0x13f;
          }
          else if (uVar11 == 2) {
            uVar8 = 0x142;
          }
          else {
            uVar8 = uVar11 == 4 ^ 0x141;
          }
          local_38._any.signature = 0x8000031;
          if (uVar11 < 5) {
            local_38._any.signature = 0x4000029;
          }
          goto LAB_001229a6;
        }
        if (srcTypeId - 0x33 < 0x32) {
          uVar8 = 0x1a2;
          if (avxEnabled) {
            uVar8 = 0x3f5;
          }
          if (uVar11 != 8) {
            uVar8 = 0x18d;
            if (avxEnabled) {
              uVar8 = 0x3df;
            }
            local_38._any.signature = 0x4000029;
          }
          goto LAB_001229a6;
        }
      }
      uVar13 = (uint)bVar1;
      if (dstTypeId - 0x31 < 2) {
        if (uVar13 <= uVar11) {
          uVar11 = uVar13;
        }
        if ((9 < uVar5) && ((local_48._any.signature & 7) != 2)) {
          uVar8 = 0x1a2;
          if ((srcTypeId - 0x31 < 2) || (uVar8 = 399, srcTypeId - 0x33 < 0x32)) goto LAB_001229a6;
          goto LAB_00122859;
        }
        uVar8 = 0x1a2;
        if ((uVar11 == 8) || (uVar8 = 0x18d, (local_48._any.signature & 7) != 1)) goto LAB_001229a6;
LAB_0012299f:
        local_48._any.signature = 0x4000029;
        goto LAB_001229a6;
      }
LAB_00122859:
      if (dstTypeId - 0x2d < 4) {
        if (uVar13 <= uVar11) {
          uVar11 = uVar13;
        }
        if ((srcTypeId - 0x2d < 4 || uVar5 < 10) || ((local_48._any.signature & 7) == 2)) {
          if (uVar11 == 1) {
            uVar8 = 0x13f;
          }
          else if (uVar11 == 2) {
            uVar8 = 0x142;
          }
          else {
            uVar8 = uVar11 == 4 ^ 0x141;
          }
          if (((local_48._any.signature & 0xf07) != 1) || (4 < uVar11)) goto LAB_001229a6;
          goto LAB_0012299f;
        }
      }
      if (0x31 < dstTypeId - 0x33) {
        return 4;
      }
      local_38._any.signature = 0x10000149;
      if (local_48._any.signature == 0x8000289) {
        uVar8 = 0x1a3;
        goto LAB_001229a6;
      }
      if (TypeId::_info[(ulong)srcTypeId + 0x80] == '+' &&
          TypeId::_info[(ulong)dstTypeId + 0x80] == '*') {
        uVar13 = uVar12 * 2;
        if (uVar11 < uVar12 * 2) {
          uVar13 = uVar11;
        }
        uVar9 = 0x83;
        if (avxEnabled) {
          uVar9 = 0x324;
        }
        uVar8 = 0x7d;
        if (avxEnabled) {
          uVar8 = 0x318;
        }
        if (uVar13 < 9) {
          uVar8 = uVar9;
        }
        if ((uVar13 & 0xfe) == 0x40) {
          local_38._any.signature = 0x20000151;
        }
        if ((local_48._any.signature & 7) == 1) {
          uVar10 = 0x40000159;
          if (uVar13 < 0x21) {
            uVar10 = 0x20000151;
          }
          local_48._any.signature = 0x10000149;
          if (0x10 < uVar13) {
            local_48._any.signature = uVar10;
          }
        }
LAB_00122b78:
        bVar15 = false;
        uVar11 = uVar13;
      }
      else {
        if (TypeId::_info[(ulong)srcTypeId + 0x80] != '*' ||
            TypeId::_info[(ulong)dstTypeId + 0x80] != '+') {
          if (uVar11 < uVar13) {
            uVar13 = uVar11;
          }
          if ((local_48._any.signature & 0xf07) == 1 || (local_48._any.signature & 7) == 2) {
            if (uVar13 < 5) {
              uVar8 = 0x18d;
              if (avxEnabled) {
                uVar8 = 0x3df;
              }
              if ((local_48._any.signature & 3) == 1) {
                local_48._any.signature = 0x4000029;
              }
            }
            else {
              if (uVar13 != 8) goto LAB_00122b20;
              uVar8 = 0x1a2;
              if (avxEnabled) {
                uVar8 = 0x3f5;
              }
            }
          }
          else {
LAB_00122b20:
            bVar15 = true;
            uVar11 = uVar13;
            if ((local_48._any.signature & 0xf07) != 0x101 && (local_48._any.signature & 7) != 2)
            goto LAB_00122b7a;
            uVar8 = 0x18b;
            if (avxEnabled) {
              uVar8 = 0x3de;
            }
            uVar10 = 0x40000159;
            if (uVar13 < 0x21) {
              uVar10 = 0x20000151;
            }
            local_38._any.signature = 0x10000149;
            if (0x10 < uVar13) {
              local_38._any.signature = uVar10;
            }
            if ((local_48._any.signature & 3) == 1) {
              local_48._any.signature = local_38._any.signature;
            }
          }
          goto LAB_00122b78;
        }
        uVar5 = uVar11 * 2;
        if (uVar13 <= uVar11 * 2) {
          uVar5 = uVar13;
        }
        uVar13 = uVar5 >> 1;
        uVar9 = 0x80;
        if (avxEnabled) {
          uVar9 = 800;
        }
        uVar8 = 0x79;
        if (avxEnabled) {
          uVar8 = 0x312;
        }
        if (uVar5 < 10) {
          uVar8 = uVar9;
        }
        uVar10 = 0x40000159;
        if ((uVar5 & 0xfe) < 0x21) {
          uVar10 = 0x20000151;
        }
        local_38._any.signature = 0x10000149;
        if (0x10 < (uVar5 & 0xfe)) {
          local_38._any.signature = uVar10;
        }
        bVar15 = false;
        uVar11 = uVar13;
        if (((local_48._any.signature & 7) == 1) && (0x3f < uVar5)) {
          local_48._any.signature = 0x20000151;
          goto LAB_00122b78;
        }
      }
LAB_00122b7a:
      if (bVar15) {
        return 4;
      }
LAB_001229a6:
      if ((local_48._any.signature & 7) == 2) {
        local_48._any.signature = uVar11 << 0x18 | local_48._any.signature & 0xfffffa;
      }
      *(char **)(emitter + 0x48) = comment;
      EVar7 = CodeEmitter::emit((CodeEmitter *)emitter,uVar8,(Operand_ *)&local_38._any,
                                (Operand_ *)&local_48._any);
      return EVar7;
    }
  }
  else {
    emitArgMove();
LAB_00122b8f:
    emitArgMove();
  }
  emitArgMove();
LAB_00122b99:
  emitArgMove();
  uVar5 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._any.id;
  pRVar3 = ((CodeEmitter *)emitter)->_nativeGpArray;
  aStack_f0._packed[0] = *(UInt64 *)(pRVar3 + 4);
  aStack_f0._mem.field_2 = pRVar3[4].super_Operand.super_Operand_.field_0._mem.field_2;
  aStack_d0._mem.field_2 = pRVar3[4].super_Operand.super_Operand_.field_0._mem.field_2;
  aStack_d0._any.signature =
       (uint32_t)*(undefined8 *)&pRVar3[4].super_Operand.super_Operand_.field_0;
  aStack_d0._any.id = 5;
  aStack_a0._packed[0] = (UInt64)((UInt64 *)(pRVar3 + 4))->field_11;
  aStack_a0._mem.field_2 = pRVar3[4].super_Operand.super_Operand_.field_0._mem.field_2;
  aStack_e0._packed[0] = (UInt64)((UInt64 *)(pRVar3 + 4))->field_11;
  aStack_e0._mem.field_2 = pRVar3[4].super_Operand.super_Operand_.field_0._mem.field_2;
  if ((undefined1  [16])
      ((undefined1  [16])dst_[1].super_Reg.super_Operand.super_Operand_.field_0 &
      (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    EVar7 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_d0._any);
    if (EVar7 != 0) {
      return EVar7;
    }
    EVar7 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_d0._any,
                              (Operand_ *)&aStack_f0._any);
    if (EVar7 != 0) {
      return EVar7;
    }
    uVar5 = uVar5 & 0xffffffdf;
    EVar7 = 0;
  }
  if (uVar5 != 0) {
    bVar15 = false;
    iVar14 = 0;
    pXStack_b8 = dst_;
    do {
      if ((uVar5 & 1) != 0) {
        aStack_a0._any.id = iVar14;
        EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x263,(Operand_ *)&aStack_a0._any);
        if (EVar6 != 0) break;
      }
      iVar14 = iVar14 + 1;
      bVar15 = uVar5 < 2;
      uVar5 = uVar5 >> 1;
      EVar6 = EVar7;
    } while (!bVar15);
    EVar7 = EVar6;
    dst_ = pXStack_b8;
    if (!bVar15) {
      return EVar7;
    }
  }
  cVar2 = *(char *)((long)&(dst_->super_Reg).super_Operand.super_Operand_.field_0 + 2);
  if ((cVar2 != '\x04') && (cVar2 != -1)) {
    aStack_e0._any.id._0_1_ = cVar2;
    aStack_e0._any.id._1_3_ = 0;
    if (((cVar2 != '\x05') ||
        ((undefined1  [16])
         ((undefined1  [16])dst_[1].super_Reg.super_Operand.super_Operand_.field_0 &
         (undefined1  [16])0x100000000) == (undefined1  [16])0x0)) &&
       (EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_e0._any,
                                  (Operand_ *)&aStack_f0._any), EVar6 != 0)) {
      return EVar6;
    }
  }
  if ((((undefined1  [16])
        ((undefined1  [16])dst_[1].super_Reg.super_Operand.super_Operand_.field_0 &
        (undefined1  [16])0x800000000) == (undefined1  [16])0x0) ||
      (EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x15,(Operand_ *)&aStack_f0._any,
                                 -(uint)*(byte *)&(dst_->super_Reg).super_Operand.super_Operand_.
                                                  field_0), EVar6 == 0)) &&
     ((o1 = (ulong)dst_[2].super_Reg.super_Operand.super_Operand_.field_0._any.signature, o1 == 0 ||
      (EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x2c4,(Operand_ *)&aStack_f0._any,o1),
      EVar6 == 0)))) {
    if ((~*(byte *)((long)&dst_[1].super_Reg.super_Operand.super_Operand_.field_0 + 4) & 10) == 0) {
      aStack_b0._any.reserved8_4 =
           dst_[2].super_Reg.super_Operand.super_Operand_.field_0._any.reserved8_4;
      aStack_b0._packed[0] = (UInt64)((ulong)(aStack_f0._any.signature & 0xf8) | 2);
      aStack_b0._any.reserved12_4 = aStack_f0._any.id;
      EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,0x189,(Operand_ *)&aStack_b0._any,
                                (Operand_ *)&aStack_e0._any);
      if (EVar6 != 0) {
        return EVar6;
      }
    }
    uVar8 = (dst_->super_Reg).super_Operand.super_Operand_.field_0._any.reserved8_4;
    if (uVar8 != 0) {
      aStack_b0._any.reserved8_4 =
           dst_[3].super_Reg.super_Operand.super_Operand_.field_0._any.reserved8_4;
      aStack_b0._packed[0] = (UInt64)((ulong)(aStack_f0._any.signature & 0xf8) | 2);
      aStack_b0._any.reserved12_4 = aStack_f0._any.id;
      aStack_88._packed[0] = (UInt64)0x10000149;
      aStack_88._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
      aVar4 = dst_[1].super_Reg.super_Operand.super_Operand_.field_0;
      bVar15 = (undefined1  [16])((undefined1  [16])aVar4 & (undefined1  [16])0x4000000000) ==
               (undefined1  [16])0x0;
      uVar9 = 0x3de;
      if (bVar15) {
        uVar9 = 0x18b;
      }
      instId = 0x3fb;
      if (bVar15) {
        instId = 0x1ac;
      }
      if ((undefined1  [16])((undefined1  [16])aVar4 & (undefined1  [16])0x400000000) !=
          (undefined1  [16])0x0) {
        instId = uVar9;
      }
      bVar15 = false;
      iVar14 = 0;
      do {
        if ((uVar8 & 1) != 0) {
          aStack_88._any.id = iVar14;
          EVar6 = CodeEmitter::emit((CodeEmitter *)emitter,instId,(Operand_ *)&aStack_b0._any,
                                    (Operand_ *)&aStack_88._any);
          if (EVar6 != 0) break;
          aStack_b0._any.reserved8_4 = aStack_b0._any.reserved8_4 + 0x10;
        }
        iVar14 = iVar14 + 1;
        bVar15 = uVar8 < 2;
        uVar8 = uVar8 >> 1;
        EVar6 = EVar7;
      } while (!bVar15);
      if (!bVar15) {
        return EVar6;
      }
    }
    EVar6 = 0;
  }
  return EVar6;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitArgMove(X86Emitter* emitter,
  const X86Reg& dst_, uint32_t dstTypeId,
  const Operand_& src_, uint32_t srcTypeId, bool avxEnabled, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (!dstTypeId) dstTypeId = x86OpData.archRegs.regTypeToTypeId[dst_.getType()];

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(dstTypeId) && !TypeId::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeId::isValid(srcTypeId) && !TypeId::isAbstract(srcTypeId));

  X86Reg dst(dst_);
  Operand src(src_);

  uint32_t dstSize = TypeId::sizeOf(dstTypeId);
  uint32_t srcSize = TypeId::sizeOf(srcTypeId);

  int32_t instId = Inst::kIdNone;

  // Not a real loop, just 'break' is nicer than 'goto'.
  for (;;) {
    if (TypeId::isInt(dstTypeId)) {
      if (TypeId::isInt(srcTypeId)) {
        instId = X86Inst::kIdMovsx;
        uint32_t typeOp = (dstTypeId << 8) | srcTypeId;

        // Sign extend by using 'movsx'.
        if (typeOp == ((TypeId::kI16 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI16) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI16)) break;

        // Sign extend by using 'movsxd'.
        instId = X86Inst::kIdMovsxd;
        if (typeOp == ((TypeId::kI64 << 8) | TypeId::kI32)) break;
      }

      if (TypeId::isInt(srcTypeId) || src_.isMem()) {
        // Zero extend by using 'movzx' or 'mov'.
        if (dstSize <= 4 && srcSize < 4) {
          instId = X86Inst::kIdMovzx;
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        }
        else {
          // We should have caught all possibilities where `srcSize` is less
          // than 4, so we don't have to worry about 'movzx' anymore. Minimum
          // size is enough to determine if we want 32-bit or 64-bit move.
          instId = X86Inst::kIdMov;
          srcSize = std::min(srcSize, dstSize);

          dst.setSignature(srcSize == 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                        : X86Reg::signatureOfT<X86Reg::kRegGpq>());
          if (src.isReg()) src.setSignature(dst.getSignature());
        }
        break;
      }

      // NOTE: The previous branch caught all memory sources, from here it's
      // always register to register conversion, so catch the remaining cases.
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isMmx(srcTypeId)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMask(srcTypeId)) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        dst.setSignature(srcSize <= 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                      : X86Reg::signatureOfT<X86Reg::kRegGpq>());
        break;
      }

      if (TypeId::isVec(srcTypeId)) {
        // 64-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isMmx(dstTypeId)) {
      instId = X86Inst::kIdMovq;
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || src.isMem()) {
        // 64-bit move.
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMmx(srcTypeId)) break;

      // NOTE: This will hurt if `avxEnabled`.
      instId = X86Inst::kIdMovdq2q;
      if (TypeId::isVec(srcTypeId)) break;
    }

    if (TypeId::isMask(dstTypeId)) {
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || TypeId::isMask(srcTypeId) || src.isMem()) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        if (X86Reg::isGp(src) && srcSize <= 4) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isVec(dstTypeId)) {
      // By default set destination to XMM, will be set to YMM|ZMM if needed.
      dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegXmm>());

      // NOTE: This will hurt if `avxEnabled`.
      if (X86Reg::isMm(src)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq2dq;
        break;
      }

      // Argument conversion.
      uint32_t dstElement = TypeId::elementOf(dstTypeId);
      uint32_t srcElement = TypeId::elementOf(srcTypeId);

      if (dstElement == TypeId::kF32 && srcElement == TypeId::kF64) {
        srcSize = std::min(dstSize * 2, srcSize);
        dstSize = srcSize / 2;

        if (srcSize <= 8)
          instId = avxEnabled ? X86Inst::kIdVcvtss2sd : X86Inst::kIdCvtss2sd;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtps2pd : X86Inst::kIdCvtps2pd;

        if (dstSize == 32)
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        if (src.isReg())
          src.setSignature(X86Reg::signatureOfVecBySize(srcSize));
        break;
      }

      if (dstElement == TypeId::kF64 && srcElement == TypeId::kF32) {
        srcSize = std::min(dstSize, srcSize * 2) / 2;
        dstSize = srcSize * 2;

        if (srcSize <= 4)
          instId = avxEnabled ? X86Inst::kIdVcvtsd2ss : X86Inst::kIdCvtsd2ss;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtpd2ps : X86Inst::kIdCvtpd2ps;

        dst.setSignature(X86Reg::signatureOfVecBySize(dstSize));
        if (src.isReg() && srcSize >= 32)
          src.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        break;
      }

      srcSize = std::min(srcSize, dstSize);
      if (X86Reg::isGp(src) || src.isMem()) {
        // 32-bit move.
        if (srcSize <= 4) {
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
          if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
          break;
        }

        // 64-bit move.
        if (srcSize == 8) {
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
          break;
        }
      }

      if (X86Reg::isVec(src) || src.isMem()) {
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
        uint32_t sign = X86Reg::signatureOfVecBySize(srcSize);

        dst.setSignature(sign);
        if (src.isReg()) src.setSignature(sign);
        break;
      }
    }

    return DebugUtils::errored(kErrorInvalidState);
  }

  if (src.isMem())
    src.as<X86Mem>().setSize(srcSize);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}